

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O1

String * __thiscall String::operator+(String *__return_storage_ptr__,String *this,String *other)

{
  usize *puVar1;
  String *other_00;
  String local_40;
  
  String(&local_40,this);
  other_00 = append(&local_40,other);
  String(__return_storage_ptr__,other_00);
  if ((local_40.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_40.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_40.data != (Data *)0x0)) {
      operator_delete__(local_40.data);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String operator+(const String& other) const {return String(*this).append(other);}